

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroup.cxx
# Opt level: O1

void __thiscall
cmSourceGroup::cmSourceGroup(cmSourceGroup *this,string *name,char *regex,char *parentName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  pointer pcVar4;
  undefined8 uVar5;
  pointer __p;
  pointer __p_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_a0;
  __uniq_ptr_impl<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_> local_80;
  undefined1 *local_78;
  undefined1 local_70 [32];
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  undefined1 *local_38;
  
  paVar1 = &(this->Name).field_2;
  (this->Name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->Name).field_2 + 8) = uVar5;
  }
  else {
    (this->Name)._M_dataplus._M_p = pcVar4;
    (this->Name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->Name)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  (this->FullName)._M_dataplus._M_p = (pointer)&(this->FullName).field_2;
  (this->FullName)._M_string_length = 0;
  (this->FullName).field_2._M_local_buf[0] = '\0';
  (this->GroupRegex).regmust = (char *)0x0;
  (this->GroupRegex).program = (char *)0x0;
  (this->GroupRegex).progsize = 0;
  memset(&this->GroupRegex,0,0xaa);
  p_Var3 = &(this->GroupFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->GroupFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->SourceFiles).
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SourceFiles).
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SourceFiles).
  super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Internal)._M_t.
  super___uniq_ptr_impl<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>._M_t.
  super__Tuple_impl<0UL,_cmSourceGroupInternals_*,_std::default_delete<cmSourceGroupInternals>_>.
  super__Head_base<0UL,_cmSourceGroupInternals_*,_false>._M_head_impl =
       (cmSourceGroupInternals *)0x0;
  __p_00 = (pointer)operator_new(0x18);
  (__p_00->GroupChildren).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p_00->GroupChildren).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p_00->GroupChildren).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80._M_t.
  super__Tuple_impl<0UL,_cmSourceGroupInternals_*,_std::default_delete<cmSourceGroupInternals>_>.
  super__Head_base<0UL,_cmSourceGroupInternals_*,_false>._M_head_impl =
       (tuple<cmSourceGroupInternals_*,_std::default_delete<cmSourceGroupInternals>_>)
       (_Tuple_impl<0UL,_cmSourceGroupInternals_*,_std::default_delete<cmSourceGroupInternals>_>)0x0
  ;
  std::__uniq_ptr_impl<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>::reset
            ((__uniq_ptr_impl<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>
              *)&this->Internal,__p_00);
  std::unique_ptr<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_>::~unique_ptr
            ((unique_ptr<cmSourceGroupInternals,_std::default_delete<cmSourceGroupInternals>_> *)
             &local_80);
  SetGroupRegex(this,regex);
  if (parentName != (char *)0x0) {
    local_50._M_len = strlen(parentName);
    local_78 = local_70;
    local_80._M_t.
    super__Tuple_impl<0UL,_cmSourceGroupInternals_*,_std::default_delete<cmSourceGroupInternals>_>.
    super__Head_base<0UL,_cmSourceGroupInternals_*,_false>._M_head_impl =
         (tuple<cmSourceGroupInternals_*,_std::default_delete<cmSourceGroupInternals>_>)
         (_Tuple_impl<0UL,_cmSourceGroupInternals_*,_std::default_delete<cmSourceGroupInternals>_>)
         0x1;
    local_70[0] = 0x5c;
    local_40 = 1;
    views._M_len = 2;
    views._M_array = &local_50;
    local_50._M_str = parentName;
    local_38 = local_78;
    cmCatViews_abi_cxx11_(&local_a0,views);
    std::__cxx11::string::operator=((string *)&this->FullName,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::_M_append((char *)&this->FullName,(ulong)(this->Name)._M_dataplus._M_p);
  return;
}

Assistant:

cmSourceGroup::cmSourceGroup(std::string name, const char* regex,
                             const char* parentName)
  : Name(std::move(name))
{
  this->Internal = cm::make_unique<cmSourceGroupInternals>();
  this->SetGroupRegex(regex);
  if (parentName) {
    this->FullName = cmStrCat(parentName, '\\');
  }
  this->FullName += this->Name;
}